

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O2

int dwarf_load_rnglists(Dwarf_Debug dbg,Dwarf_Unsigned *rnglists_count,Dwarf_Error *error)

{
  Dwarf_Chain pDVar1;
  Dwarf_Unsigned DVar2;
  int iVar3;
  Dwarf_Rnglists_Context buildhere;
  Dwarf_Chain pDVar4;
  Dwarf_Rnglists_Context *ppDVar5;
  char *msg;
  Dwarf_Chain *ppDVar6;
  size_t __size;
  Dwarf_Small *pDVar7;
  Dwarf_Unsigned DVar8;
  Dwarf_Small *data;
  Dwarf_Signed errval;
  Dwarf_Chain local_60;
  Dwarf_Unsigned local_58;
  Dwarf_Unsigned local_50;
  Dwarf_Small *local_48;
  Dwarf_Unsigned nextoffset;
  Dwarf_Unsigned *local_38;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_load_rnglistseither null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    if (dbg->de_rnglists_context != (Dwarf_Rnglists_Context *)0x0) {
      if (rnglists_count != (Dwarf_Unsigned *)0x0) {
        *rnglists_count = dbg->de_rnglists_context_count;
        return 0;
      }
      return 0;
    }
    local_58 = (dbg->de_debug_rnglists).dss_size;
    if (local_58 == 0) {
      return -1;
    }
    pDVar7 = (dbg->de_debug_rnglists).dss_data;
    if (pDVar7 == (Dwarf_Small *)0x0) {
      iVar3 = _dwarf_load_section(dbg,&dbg->de_debug_rnglists,error);
      if (iVar3 != 0) {
        return iVar3;
      }
      pDVar7 = (dbg->de_debug_rnglists).dss_data;
      local_58 = (dbg->de_debug_rnglists).dss_size;
    }
    nextoffset = 0;
    ppDVar6 = &local_60;
    local_60 = (Dwarf_Chain)0x0;
    local_48 = pDVar7 + local_58;
    __size = 0;
    local_50 = 0;
    data = pDVar7;
    local_38 = rnglists_count;
    while (DVar2 = nextoffset, data < local_48) {
      buildhere = (Dwarf_Rnglists_Context)calloc(1,0x88);
      if (buildhere == (Dwarf_Rnglists_Context)0x0) {
        free_rnglists_chain(dbg,local_60);
        msg = "DW_DLE_ALLOC_FAIL: Allocation of Rnglists_Context failed";
        goto LAB_001d276e;
      }
      buildhere->rc_magic = 0xabcd;
      iVar3 = _dwarf_internal_read_rnglists_header
                        (dbg,1,local_50,local_58,data,local_48,DVar2,buildhere,&nextoffset,error);
      if (iVar3 == 1) {
        free_rnglists_context(buildhere);
LAB_001d272a:
        free_rnglists_chain(dbg,local_60);
        return 1;
      }
      buildhere->rc_magic = 0xabcd;
      pDVar4 = (Dwarf_Chain)_dwarf_get_alloc(dbg,'\x1f',1);
      if (pDVar4 == (Dwarf_Chain)0x0) {
        _dwarf_error_string(dbg,error,0x3e,
                            "DW_DLE_ALLOC_FAIL: allocating Rnglists_Context chain entry");
        free_rnglists_context(buildhere);
        goto LAB_001d272a;
      }
      pDVar4->ch_item = buildhere;
      local_50 = local_50 + 1;
      *ppDVar6 = pDVar4;
      ppDVar6 = &pDVar4->ch_next;
      __size = __size + 8;
      data = pDVar7 + nextoffset;
    }
    ppDVar5 = (Dwarf_Rnglists_Context *)malloc(__size);
    DVar2 = local_50;
    if (ppDVar5 != (Dwarf_Rnglists_Context *)0x0) {
      pDVar4 = local_60;
      for (DVar8 = 0; DVar2 != DVar8; DVar8 = DVar8 + 1) {
        ppDVar5[DVar8] = (Dwarf_Rnglists_Context)pDVar4->ch_item;
        pDVar4->ch_item = (void *)0x0;
        pDVar1 = pDVar4->ch_next;
        dwarf_dealloc(dbg,pDVar4,0x1f);
        pDVar4 = pDVar1;
      }
      dbg->de_rnglists_context = ppDVar5;
      dbg->de_rnglists_context_count = DVar2;
      if (local_38 != (Dwarf_Unsigned *)0x0) {
        *local_38 = DVar2;
        return 0;
      }
      return 0;
    }
    free_rnglists_chain(dbg,local_60);
    msg = "Allocation of Rnglists_Context pointer array failed";
LAB_001d276e:
    errval = 0x3e;
  }
  _dwarf_error_string(dbg,error,errval,msg);
  return 1;
}

Assistant:

int dwarf_load_rnglists(
    Dwarf_Debug dbg,
    Dwarf_Unsigned *rnglists_count,
    Dwarf_Error *error)
{
    int res = DW_DLV_ERROR;
    Dwarf_Rnglists_Context *cxt = 0;
    Dwarf_Unsigned count = 0;

    CHECK_DBG(dbg,error,"dwarf_load_rnglists");
    if (dbg->de_rnglists_context) {
        if (rnglists_count) {
            *rnglists_count = dbg->de_rnglists_context_count;
        }
        return DW_DLV_OK;
    }
    if (!dbg->de_debug_rnglists.dss_size) {
        /* nothing there. */
        return DW_DLV_NO_ENTRY;
    }
    if (!dbg->de_debug_rnglists.dss_data) {
        res = _dwarf_load_section(dbg, &dbg->de_debug_rnglists,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    res = internal_load_rnglists_contexts(dbg,&cxt,&count,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    dbg->de_rnglists_context = cxt;
    dbg->de_rnglists_context_count = count;
    if (rnglists_count) {
        *rnglists_count = count;
    }
    return DW_DLV_OK;
}